

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  ulong *puVar2;
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  _func_int **pp_Var17;
  ulong *puVar18;
  undefined4 uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  vint4 ai;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  vint4 ai_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 ai_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 bi_1;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_3;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai_2;
  undefined1 auVar61 [16];
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  vint<4> mask;
  vint4 bi_8;
  vint<4> octant;
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  AccelData *local_2698;
  ulong local_2690;
  RayHitK<4> *local_2688;
  RayQueryContext *local_2680;
  ulong local_2678;
  ulong local_2670;
  long local_2668;
  long local_2660;
  ulong local_2658;
  undefined1 local_2650 [16];
  RTCIntersectFunctionNArguments local_2640;
  Geometry *local_2610;
  undefined8 local_2608;
  RTCIntersectArguments *local_2600;
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [8];
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [8];
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  undefined4 uStack_24a4;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [8];
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [8];
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [8];
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [8];
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  undefined4 uStack_23a4;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  auVar30 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar33 = vpcmpeqd_avx(auVar30,(undefined1  [16])valid_i->field_0);
  uVar16 = vmovmskps_avx(auVar33);
  if (uVar16 != 0) {
    local_2698 = This->ptr;
    local_2690 = (ulong)(uVar16 & 0xff);
    auVar64 = ZEXT1664(*(undefined1 (*) [16])ray);
    auVar65 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
    auVar66 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
    auVar36 = *(undefined1 (*) [16])(ray + 0x40);
    auVar40._8_4_ = 0x7fffffff;
    auVar40._0_8_ = 0x7fffffff7fffffff;
    auVar40._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx(auVar36,auVar40);
    auVar51._8_4_ = 0x219392ef;
    auVar51._0_8_ = 0x219392ef219392ef;
    auVar51._12_4_ = 0x219392ef;
    auVar44 = vcmpps_avx(auVar44,auVar51,1);
    auVar42 = vblendvps_avx(auVar36,auVar51,auVar44);
    auVar44 = *(undefined1 (*) [16])(ray + 0x50);
    auVar48 = vandps_avx(auVar44,auVar40);
    auVar48 = vcmpps_avx(auVar48,auVar51,1);
    auVar41 = vblendvps_avx(auVar44,auVar51,auVar48);
    auVar48 = *(undefined1 (*) [16])(ray + 0x60);
    auVar40 = vandps_avx(auVar48,auVar40);
    auVar40 = vcmpps_avx(auVar40,auVar51,1);
    auVar40 = vblendvps_avx(auVar48,auVar51,auVar40);
    auVar47 = vrcpps_avx(auVar42);
    fVar6 = auVar47._0_4_;
    auVar46._0_4_ = auVar42._0_4_ * fVar6;
    fVar7 = auVar47._4_4_;
    auVar46._4_4_ = auVar42._4_4_ * fVar7;
    fVar8 = auVar47._8_4_;
    auVar46._8_4_ = auVar42._8_4_ * fVar8;
    fVar9 = auVar47._12_4_;
    auVar46._12_4_ = auVar42._12_4_ * fVar9;
    auVar62._8_4_ = 0x3f800000;
    auVar62._0_8_ = 0x3f8000003f800000;
    auVar62._12_4_ = 0x3f800000;
    auVar42 = vsubps_avx(auVar62,auVar46);
    local_25a0._0_4_ = fVar6 + fVar6 * auVar42._0_4_;
    local_25a0._4_4_ = fVar7 + fVar7 * auVar42._4_4_;
    local_25a0._8_4_ = fVar8 + fVar8 * auVar42._8_4_;
    local_25a0._12_4_ = fVar9 + fVar9 * auVar42._12_4_;
    auVar67 = ZEXT1664(local_25a0);
    auVar42 = vrcpps_avx(auVar41);
    fVar6 = auVar42._0_4_;
    auVar52._0_4_ = auVar41._0_4_ * fVar6;
    fVar7 = auVar42._4_4_;
    auVar52._4_4_ = auVar41._4_4_ * fVar7;
    fVar8 = auVar42._8_4_;
    auVar52._8_4_ = auVar41._8_4_ * fVar8;
    fVar9 = auVar42._12_4_;
    auVar52._12_4_ = auVar41._12_4_ * fVar9;
    auVar42 = vsubps_avx(auVar62,auVar52);
    local_25b0._0_4_ = fVar6 + fVar6 * auVar42._0_4_;
    local_25b0._4_4_ = fVar7 + fVar7 * auVar42._4_4_;
    local_25b0._8_4_ = fVar8 + fVar8 * auVar42._8_4_;
    local_25b0._12_4_ = fVar9 + fVar9 * auVar42._12_4_;
    auVar68 = ZEXT1664(local_25b0);
    auVar42 = vrcpps_avx(auVar40);
    fVar6 = auVar42._0_4_;
    auVar41._0_4_ = auVar40._0_4_ * fVar6;
    fVar7 = auVar42._4_4_;
    auVar41._4_4_ = auVar40._4_4_ * fVar7;
    fVar8 = auVar42._8_4_;
    auVar41._8_4_ = auVar40._8_4_ * fVar8;
    fVar9 = auVar42._12_4_;
    auVar41._12_4_ = auVar40._12_4_ * fVar9;
    auVar40 = vsubps_avx(auVar62,auVar41);
    local_25c0._0_4_ = fVar6 + fVar6 * auVar40._0_4_;
    local_25c0._4_4_ = fVar7 + fVar7 * auVar40._4_4_;
    local_25c0._8_4_ = fVar8 + fVar8 * auVar40._8_4_;
    local_25c0._12_4_ = fVar9 + fVar9 * auVar40._12_4_;
    auVar63 = ZEXT1664(local_25c0);
    auVar40 = ZEXT416(0) << 0x20;
    local_25d0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar40);
    local_25e0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar40);
    auVar36 = vcmpps_avx(auVar36,auVar40,1);
    auVar42._8_4_ = 1;
    auVar42._0_8_ = 0x100000001;
    auVar42._12_4_ = 1;
    auVar36 = vandps_avx(auVar36,auVar42);
    auVar44 = vcmpps_avx(auVar44,auVar40,1);
    auVar47._8_4_ = 2;
    auVar47._0_8_ = 0x200000002;
    auVar47._12_4_ = 2;
    auVar44 = vandps_avx(auVar44,auVar47);
    auVar44 = vorps_avx(auVar44,auVar36);
    auVar36 = vcmpps_avx(auVar48,auVar40,1);
    auVar48._8_4_ = 4;
    auVar48._0_8_ = 0x400000004;
    auVar48._12_4_ = 4;
    auVar36 = vandps_avx(auVar36,auVar48);
    auVar30 = vpor_avx(auVar33 ^ auVar30,auVar36);
    local_2650 = vpor_avx(auVar30,auVar44);
    local_2570 = *(undefined1 (*) [16])ray;
    local_2580 = *(undefined1 (*) [16])(ray + 0x10);
    local_2590 = *(undefined1 (*) [16])(ray + 0x20);
    local_2688 = ray;
    local_2680 = context;
    do {
      lVar5 = 0;
      if (local_2690 != 0) {
        for (; (local_2690 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      uVar19 = *(undefined4 *)(local_2650 + lVar5 * 4);
      auVar30._4_4_ = uVar19;
      auVar30._0_4_ = uVar19;
      auVar30._8_4_ = uVar19;
      auVar30._12_4_ = uVar19;
      auVar44 = vpcmpeqd_avx(auVar30,local_2650);
      uVar19 = vmovmskps_avx(auVar44);
      local_2690 = ~CONCAT44((int)((ulong)lVar5 >> 0x20),uVar19) & local_2690;
      auVar58._8_4_ = 0x7f800000;
      auVar58._0_8_ = 0x7f8000007f800000;
      auVar58._12_4_ = 0x7f800000;
      auVar30 = vblendvps_avx(auVar58,auVar64._0_16_,auVar44);
      auVar33 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vminps_avx(auVar33,auVar30);
      auVar33 = vshufpd_avx(auVar30,auVar30,1);
      auVar33 = vminps_avx(auVar33,auVar30);
      auVar30 = vblendvps_avx(auVar58,auVar65._0_16_,auVar44);
      auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vminps_avx(auVar36,auVar30);
      auVar36 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vminps_avx(auVar36,auVar30);
      auVar33 = vinsertps_avx(auVar33,auVar30,0x1c);
      auVar30 = vblendvps_avx(auVar58,auVar66._0_16_,auVar44);
      auVar36 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vminps_avx(auVar36,auVar30);
      auVar36 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vminps_avx(auVar36,auVar30);
      auVar36 = vinsertps_avx(auVar33,auVar30,0x20);
      auVar61._8_4_ = 0xff800000;
      auVar61._0_8_ = 0xff800000ff800000;
      auVar61._12_4_ = 0xff800000;
      auVar30 = vblendvps_avx(auVar61,auVar64._0_16_,auVar44);
      auVar33 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vmaxps_avx(auVar33,auVar30);
      auVar33 = vshufpd_avx(auVar30,auVar30,1);
      auVar33 = vmaxps_avx(auVar33,auVar30);
      auVar30 = vblendvps_avx(auVar61,auVar65._0_16_,auVar44);
      auVar48 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vmaxps_avx(auVar48,auVar30);
      auVar48 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vmaxps_avx(auVar48,auVar30);
      auVar33 = vinsertps_avx(auVar33,auVar30,0x1c);
      auVar30 = vblendvps_avx(auVar61,auVar66._0_16_,auVar44);
      auVar48 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vmaxps_avx(auVar48,auVar30);
      auVar48 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vmaxps_avx(auVar48,auVar30);
      auVar48 = vinsertps_avx(auVar33,auVar30,0x20);
      auVar30 = vblendvps_avx(auVar58,auVar67._0_16_,auVar44);
      auVar33 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vminps_avx(auVar33,auVar30);
      auVar33 = vshufpd_avx(auVar30,auVar30,1);
      auVar33 = vminps_avx(auVar33,auVar30);
      auVar30 = vblendvps_avx(auVar58,auVar68._0_16_,auVar44);
      auVar40 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vminps_avx(auVar40,auVar30);
      auVar40 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vminps_avx(auVar40,auVar30);
      auVar33 = vinsertps_avx(auVar33,auVar30,0x1c);
      auVar30 = vblendvps_avx(auVar58,auVar63._0_16_,auVar44);
      auVar40 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vminps_avx(auVar40,auVar30);
      auVar40 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vminps_avx(auVar40,auVar30);
      auVar40 = vinsertps_avx(auVar33,auVar30,0x20);
      auVar30 = vblendvps_avx(auVar61,auVar67._0_16_,auVar44);
      auVar33 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vmaxps_avx(auVar33,auVar30);
      auVar33 = vshufpd_avx(auVar30,auVar30,1);
      auVar33 = vmaxps_avx(auVar33,auVar30);
      auVar30 = vblendvps_avx(auVar61,auVar68._0_16_,auVar44);
      auVar42 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vmaxps_avx(auVar42,auVar30);
      auVar42 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vmaxps_avx(auVar42,auVar30);
      auVar33 = vinsertps_avx(auVar33,auVar30,0x1c);
      auVar30 = vblendvps_avx(auVar61,auVar63._0_16_,auVar44);
      auVar42 = vshufps_avx(auVar30,auVar30,0xb1);
      auVar30 = vmaxps_avx(auVar42,auVar30);
      auVar42 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vmaxps_avx(auVar42,auVar30);
      auVar42 = vinsertps_avx(auVar33,auVar30,0x20);
      local_2550 = vblendvps_avx(auVar58,local_25d0,auVar44);
      auVar30 = vshufps_avx(local_2550,local_2550,0xb1);
      auVar47 = vminps_avx(auVar30,local_2550);
      local_26c0 = vblendvps_avx(auVar61,local_25e0,auVar44);
      auVar30 = vshufps_avx(local_26c0,local_26c0,0xb1);
      auVar41 = vmaxps_avx(auVar30,local_26c0);
      auVar46 = vshufpd_avx(auVar41,auVar41,1);
      auVar44 = vcmpps_avx(auVar40,_DAT_01f7aa10,5);
      auVar30 = vblendvps_avx(auVar42,auVar40,auVar44);
      auVar33 = vblendvps_avx(auVar36,auVar48,auVar44);
      auVar36 = vblendvps_avx(auVar48,auVar36,auVar44);
      local_26b0 = vmaxps_avx(auVar46,auVar41);
      auVar48 = vmovshdup_avx(auVar30);
      uVar24 = (ulong)(auVar48._0_4_ < 0.0) << 5 | 0x40;
      auVar48 = vshufpd_avx(auVar30,auVar30,1);
      uVar29 = (ulong)(auVar48._0_4_ < 0.0) << 5 | 0x80;
      local_2658 = uVar24 ^ 0x20;
      auVar44 = vblendvps_avx(auVar40,auVar42,auVar44);
      auVar53._0_4_ = auVar33._0_4_ * auVar30._0_4_;
      auVar53._4_4_ = auVar33._4_4_ * auVar30._4_4_;
      auVar53._8_4_ = auVar33._8_4_ * auVar30._8_4_;
      auVar53._12_4_ = auVar33._12_4_ * auVar30._12_4_;
      auVar43._0_4_ = auVar36._0_4_ * auVar44._0_4_;
      auVar43._4_4_ = auVar36._4_4_ * auVar44._4_4_;
      auVar43._8_4_ = auVar36._8_4_ * auVar44._8_4_;
      auVar43._12_4_ = auVar36._12_4_ * auVar44._12_4_;
      uVar23 = (ulong)(auVar30._0_4_ < 0.0) << 5;
      uVar25 = uVar23 ^ 0x20;
      local_23a0 = *(ulong *)&local_2698[1].bounds.bounds0.lower.field_0;
      local_2398[0] = 0;
      auVar33 = vshufps_avx(auVar30,auVar30,0);
      register0x00001310 = auVar33;
      _local_23c0 = auVar33;
      auVar33 = vshufps_avx(auVar53,auVar53,0);
      local_23e0._16_16_ = auVar33;
      local_23e0._0_16_ = auVar33;
      auVar33 = vshufps_avx(auVar30,auVar30,0x55);
      register0x00001310 = auVar33;
      _local_2400 = auVar33;
      auVar33 = vshufps_avx(auVar53,auVar53,0x55);
      local_2420._16_16_ = auVar33;
      local_2420._0_16_ = auVar33;
      auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
      register0x00001250 = auVar30;
      _local_2440 = auVar30;
      auVar30 = vshufps_avx(auVar53,auVar53,0xaa);
      local_2460._16_16_ = auVar30;
      local_2460._0_16_ = auVar30;
      auVar30 = vshufps_avx(auVar44,auVar44,0);
      register0x00001250 = auVar30;
      _local_2480 = auVar30;
      auVar30 = vshufps_avx(auVar43,auVar43,0);
      local_24a0._16_16_ = auVar30;
      local_24a0._0_16_ = auVar30;
      auVar30 = vshufps_avx(auVar44,auVar44,0x55);
      register0x00001250 = auVar30;
      _local_24c0 = auVar30;
      auVar30 = vshufps_avx(auVar47,auVar47,0);
      auVar33 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar30 = vminps_avx(auVar33,auVar30);
      auVar33 = vshufps_avx(auVar43,auVar43,0x55);
      local_24e0._16_16_ = auVar33;
      local_24e0._0_16_ = auVar33;
      auVar33 = vshufps_avx(auVar44,auVar44,0xaa);
      register0x00001250 = auVar33;
      _local_2500 = auVar33;
      auVar33 = vshufps_avx(auVar43,auVar43,0xaa);
      local_2520._16_16_ = auVar33;
      local_2520._0_16_ = auVar33;
      local_2540._16_16_ = auVar30;
      local_2540._0_16_ = auVar30;
      puVar18 = local_2390;
      auVar30 = vshufps_avx(local_26b0,local_26b0,0);
      auVar32 = ZEXT1664(auVar30);
      local_2678 = uVar24;
      local_2670 = uVar23;
      do {
        uVar19 = (undefined4)puVar18[-1];
        auVar33._4_4_ = uVar19;
        auVar33._0_4_ = uVar19;
        auVar33._8_4_ = uVar19;
        auVar33._12_4_ = uVar19;
        auVar35 = ZEXT1664(auVar33);
        puVar18 = puVar18 + -2;
        auVar30 = vcmpps_avx(auVar33,local_26c0,1);
        if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar30[0xf] < '\0') {
          uVar26 = *puVar18;
          while ((uVar26 & 8) == 0) {
            pfVar4 = (float *)(uVar26 + 0x40 + uVar23);
            auVar10._4_4_ = (float)local_23c0._4_4_ * pfVar4[1];
            auVar10._0_4_ = (float)local_23c0._0_4_ * *pfVar4;
            auVar10._8_4_ = fStack_23b8 * pfVar4[2];
            auVar10._12_4_ = fStack_23b4 * pfVar4[3];
            auVar10._16_4_ = fStack_23b0 * pfVar4[4];
            auVar10._20_4_ = fStack_23ac * pfVar4[5];
            auVar10._24_4_ = fStack_23a8 * pfVar4[6];
            auVar10._28_4_ = uStack_23a4;
            auVar10 = vsubps_avx(auVar10,local_23e0);
            pfVar4 = (float *)(uVar26 + 0x40 + uVar24);
            auVar11._4_4_ = (float)local_2400._4_4_ * pfVar4[1];
            auVar11._0_4_ = (float)local_2400._0_4_ * *pfVar4;
            auVar11._8_4_ = fStack_23f8 * pfVar4[2];
            auVar11._12_4_ = fStack_23f4 * pfVar4[3];
            auVar11._16_4_ = fStack_23f0 * pfVar4[4];
            auVar11._20_4_ = fStack_23ec * pfVar4[5];
            auVar11._24_4_ = fStack_23e8 * pfVar4[6];
            auVar11._28_4_ = uStack_23e4;
            pfVar4 = (float *)(uVar26 + 0x40 + uVar29);
            auVar12._4_4_ = (float)local_2440._4_4_ * pfVar4[1];
            auVar12._0_4_ = (float)local_2440._0_4_ * *pfVar4;
            auVar12._8_4_ = fStack_2438 * pfVar4[2];
            auVar12._12_4_ = fStack_2434 * pfVar4[3];
            auVar12._16_4_ = fStack_2430 * pfVar4[4];
            auVar12._20_4_ = fStack_242c * pfVar4[5];
            auVar12._24_4_ = fStack_2428 * pfVar4[6];
            auVar12._28_4_ = uStack_2424;
            auVar11 = vsubps_avx(auVar11,local_2420);
            auVar12 = vsubps_avx(auVar12,local_2460);
            pfVar4 = (float *)(uVar26 + 0x40 + uVar25);
            auVar13._4_4_ = (float)local_2480._4_4_ * pfVar4[1];
            auVar13._0_4_ = (float)local_2480._0_4_ * *pfVar4;
            auVar13._8_4_ = fStack_2478 * pfVar4[2];
            auVar13._12_4_ = fStack_2474 * pfVar4[3];
            auVar13._16_4_ = fStack_2470 * pfVar4[4];
            auVar13._20_4_ = fStack_246c * pfVar4[5];
            auVar13._24_4_ = fStack_2468 * pfVar4[6];
            auVar13._28_4_ = uStack_2464;
            auVar13 = vsubps_avx(auVar13,local_24a0);
            auVar30 = vpmaxsd_avx(auVar10._0_16_,auVar11._0_16_);
            auVar33 = vpmaxsd_avx(auVar10._16_16_,auVar11._16_16_);
            auVar36 = vpmaxsd_avx(auVar12._0_16_,local_2540._0_16_);
            auVar30 = vpmaxsd_avx(auVar30,auVar36);
            auVar36 = vpmaxsd_avx(auVar12._16_16_,local_2540._16_16_);
            pfVar4 = (float *)(uVar26 + 0x40 + local_2658);
            auVar14._4_4_ = (float)local_24c0._4_4_ * pfVar4[1];
            auVar14._0_4_ = (float)local_24c0._0_4_ * *pfVar4;
            auVar14._8_4_ = fStack_24b8 * pfVar4[2];
            auVar14._12_4_ = fStack_24b4 * pfVar4[3];
            auVar14._16_4_ = fStack_24b0 * pfVar4[4];
            auVar14._20_4_ = fStack_24ac * pfVar4[5];
            auVar14._24_4_ = fStack_24a8 * pfVar4[6];
            auVar14._28_4_ = uStack_24a4;
            auVar10 = vsubps_avx(auVar14,local_24e0);
            auVar33 = vpmaxsd_avx(auVar33,auVar36);
            auVar34._16_16_ = auVar33;
            auVar34._0_16_ = auVar30;
            auVar36 = vpminsd_avx(auVar13._16_16_,auVar10._16_16_);
            pfVar4 = (float *)(uVar26 + 0x40 + (uVar29 ^ 0x20));
            auVar15._4_4_ = (float)local_2500._4_4_ * pfVar4[1];
            auVar15._0_4_ = (float)local_2500._0_4_ * *pfVar4;
            auVar15._8_4_ = fStack_24f8 * pfVar4[2];
            auVar15._12_4_ = fStack_24f4 * pfVar4[3];
            auVar15._16_4_ = fStack_24f0 * pfVar4[4];
            auVar15._20_4_ = fStack_24ec * pfVar4[5];
            auVar15._24_4_ = fStack_24e8 * pfVar4[6];
            auVar15._28_4_ = uStack_24e4;
            auVar11 = vsubps_avx(auVar15,local_2520);
            auVar44 = vpminsd_avx(auVar13._0_16_,auVar10._0_16_);
            auVar48 = vpminsd_avx(auVar11._0_16_,auVar32._0_16_);
            auVar44 = vpminsd_avx(auVar44,auVar48);
            auVar48 = vpminsd_avx(auVar11._16_16_,auVar32._0_16_);
            auVar36 = vpminsd_avx(auVar36,auVar48);
            auVar39._16_16_ = auVar36;
            auVar39._0_16_ = auVar44;
            local_2640.valid = (int *)auVar30._0_8_;
            local_2640.geometryUserPtr = (void *)auVar30._8_8_;
            local_2640.primID = auVar33._0_4_;
            local_2640._20_4_ = auVar33._4_4_;
            local_2640.context = (RTCRayQueryContext *)auVar33._8_8_;
            auVar10 = vcmpps_avx(auVar34,auVar39,2);
            iVar20 = vmovmskps_avx(auVar10);
            if (iVar20 == 0) goto LAB_0041ea11;
            uVar22 = (ulong)(byte)iVar20;
            auVar35 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar21 = 0;
            uVar27 = 8;
            do {
              lVar5 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              uVar19 = *(undefined4 *)(uVar26 + 0x40 + lVar5 * 4);
              auVar36._4_4_ = uVar19;
              auVar36._0_4_ = uVar19;
              auVar36._8_4_ = uVar19;
              auVar36._12_4_ = uVar19;
              auVar30 = vsubps_avx(auVar36,auVar64._0_16_);
              auVar37._0_4_ = auVar67._0_4_ * auVar30._0_4_;
              auVar37._4_4_ = auVar67._4_4_ * auVar30._4_4_;
              auVar37._8_4_ = auVar67._8_4_ * auVar30._8_4_;
              auVar37._12_4_ = auVar67._12_4_ * auVar30._12_4_;
              uVar19 = *(undefined4 *)(uVar26 + 0x80 + lVar5 * 4);
              auVar44._4_4_ = uVar19;
              auVar44._0_4_ = uVar19;
              auVar44._8_4_ = uVar19;
              auVar44._12_4_ = uVar19;
              auVar30 = vsubps_avx(auVar44,auVar65._0_16_);
              auVar45._0_4_ = auVar68._0_4_ * auVar30._0_4_;
              auVar45._4_4_ = auVar68._4_4_ * auVar30._4_4_;
              auVar45._8_4_ = auVar68._8_4_ * auVar30._8_4_;
              auVar45._12_4_ = auVar68._12_4_ * auVar30._12_4_;
              uVar19 = *(undefined4 *)(uVar26 + 0xc0 + lVar5 * 4);
              auVar49._4_4_ = uVar19;
              auVar49._0_4_ = uVar19;
              auVar49._8_4_ = uVar19;
              auVar49._12_4_ = uVar19;
              auVar30 = vsubps_avx(auVar49,auVar66._0_16_);
              auVar50._0_4_ = auVar63._0_4_ * auVar30._0_4_;
              auVar50._4_4_ = auVar63._4_4_ * auVar30._4_4_;
              auVar50._8_4_ = auVar63._8_4_ * auVar30._8_4_;
              auVar50._12_4_ = auVar63._12_4_ * auVar30._12_4_;
              uVar19 = *(undefined4 *)(uVar26 + 0x60 + lVar5 * 4);
              auVar54._4_4_ = uVar19;
              auVar54._0_4_ = uVar19;
              auVar54._8_4_ = uVar19;
              auVar54._12_4_ = uVar19;
              auVar30 = vsubps_avx(auVar54,auVar64._0_16_);
              auVar55._0_4_ = auVar67._0_4_ * auVar30._0_4_;
              auVar55._4_4_ = auVar67._4_4_ * auVar30._4_4_;
              auVar55._8_4_ = auVar67._8_4_ * auVar30._8_4_;
              auVar55._12_4_ = auVar67._12_4_ * auVar30._12_4_;
              uVar19 = *(undefined4 *)(uVar26 + 0xa0 + lVar5 * 4);
              auVar56._4_4_ = uVar19;
              auVar56._0_4_ = uVar19;
              auVar56._8_4_ = uVar19;
              auVar56._12_4_ = uVar19;
              auVar30 = vsubps_avx(auVar56,auVar65._0_16_);
              auVar57._0_4_ = auVar68._0_4_ * auVar30._0_4_;
              auVar57._4_4_ = auVar68._4_4_ * auVar30._4_4_;
              auVar57._8_4_ = auVar68._8_4_ * auVar30._8_4_;
              auVar57._12_4_ = auVar68._12_4_ * auVar30._12_4_;
              uVar19 = *(undefined4 *)(uVar26 + 0xe0 + lVar5 * 4);
              auVar59._4_4_ = uVar19;
              auVar59._0_4_ = uVar19;
              auVar59._8_4_ = uVar19;
              auVar59._12_4_ = uVar19;
              auVar30 = vsubps_avx(auVar59,auVar66._0_16_);
              auVar60._0_4_ = auVar63._0_4_ * auVar30._0_4_;
              auVar60._4_4_ = auVar63._4_4_ * auVar30._4_4_;
              auVar60._8_4_ = auVar63._8_4_ * auVar30._8_4_;
              auVar60._12_4_ = auVar63._12_4_ * auVar30._12_4_;
              auVar30 = vpminsd_avx(auVar37,auVar55);
              auVar33 = vpminsd_avx(auVar45,auVar57);
              auVar30 = vpmaxsd_avx(auVar30,auVar33);
              auVar44 = vpminsd_avx(auVar50,auVar60);
              auVar33 = vpmaxsd_avx(auVar37,auVar55);
              auVar36 = vpmaxsd_avx(auVar45,auVar57);
              auVar48 = vpminsd_avx(auVar33,auVar36);
              auVar33 = vpmaxsd_avx(auVar50,auVar60);
              auVar36 = vpmaxsd_avx(auVar44,local_2550);
              auVar30 = vpmaxsd_avx(auVar30,auVar36);
              auVar33 = vpminsd_avx(auVar33,local_26c0);
              auVar33 = vpminsd_avx(auVar48,auVar33);
              auVar30 = vcmpps_avx(auVar30,auVar33,2);
              uVar28 = uVar27;
              if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar30[0xf] < '\0') {
                uVar19 = *(undefined4 *)((long)&local_2640.valid + lVar5 * 4);
                auVar38._4_4_ = uVar19;
                auVar38._0_4_ = uVar19;
                auVar38._8_4_ = uVar19;
                auVar38._12_4_ = uVar19;
                uVar28 = *(ulong *)(uVar26 + lVar5 * 8);
                auVar33 = auVar35._0_16_;
                auVar30 = vcmpps_avx(auVar38,auVar33,1);
                if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar30[0xf]) {
                  *puVar18 = uVar28;
                  uVar28 = uVar27;
                }
                else {
                  if (uVar27 == 8) {
                    auVar35 = ZEXT1664(auVar38);
                    goto LAB_0041e788;
                  }
                  *puVar18 = uVar27;
                  auVar35 = ZEXT1664(auVar38);
                  auVar38 = auVar33;
                }
                uVar21 = uVar21 + 1;
                *(int *)(puVar18 + 1) = auVar38._0_4_;
                puVar18 = puVar18 + 2;
              }
LAB_0041e788:
              uVar22 = uVar22 & uVar22 - 1;
              uVar27 = uVar28;
            } while (uVar22 != 0);
            if (uVar28 == 8) goto LAB_0041ea11;
            uVar26 = uVar28;
            if (1 < uVar21) {
              pauVar1 = (undefined1 (*) [16])(puVar18 + -4);
              puVar2 = puVar18 + -2;
              if ((uint)puVar18[-3] < (uint)puVar18[-1]) {
                *(int *)(puVar18 + -3) = (int)puVar18[-1];
                *(ulong *)*pauVar1 = *puVar2;
                local_26d0._0_8_ = SUB168(*pauVar1,0);
                *puVar2 = local_26d0._0_8_;
                local_26d0._8_4_ = SUB164(*pauVar1,8);
                *(undefined4 *)(puVar18 + -1) = local_26d0._8_4_;
              }
              if (uVar21 != 2) {
                pauVar3 = (undefined1 (*) [16])(puVar18 + -6);
                uVar16 = (uint)puVar18[-5];
                if (uVar16 < (uint)puVar18[-1]) {
                  *(int *)(puVar18 + -5) = (int)puVar18[-1];
                  *(ulong *)*pauVar3 = *puVar2;
                  local_26d0._0_8_ = SUB168(*pauVar3,0);
                  *puVar2 = local_26d0._0_8_;
                  local_26d0._8_4_ = SUB164(*pauVar3,8);
                  *(undefined4 *)(puVar18 + -1) = local_26d0._8_4_;
                  uVar16 = (uint)puVar18[-5];
                }
                if (uVar16 < (uint)puVar18[-3]) {
                  auVar30 = *pauVar3;
                  *(int *)(puVar18 + -5) = (int)puVar18[-3];
                  *(undefined8 *)*pauVar3 = *(undefined8 *)*pauVar1;
                  local_26d0._0_8_ = auVar30._0_8_;
                  *(undefined8 *)*pauVar1 = local_26d0._0_8_;
                  local_26d0._8_4_ = auVar30._8_4_;
                  *(undefined4 *)(puVar18 + -3) = local_26d0._8_4_;
                }
              }
            }
          }
          auVar30 = vcmpps_avx(local_26c0,auVar35._0_16_,6);
          auVar32 = ZEXT1664(auVar30);
          if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar30[0xf] < '\0') {
            local_2668 = (ulong)((uint)uVar26 & 0xf) - 8;
            if (local_2668 != 0) {
              local_2660 = 0;
              local_2560 = auVar30;
              do {
                local_2640.geomID = *(uint *)((uVar26 & 0xfffffffffffffff0) + local_2660 * 8);
                local_2610 = (context->scene->geometries).items[local_2640.geomID].ptr;
                uVar16 = local_2610->mask;
                auVar31._4_4_ = uVar16;
                auVar31._0_4_ = uVar16;
                auVar31._8_4_ = uVar16;
                auVar31._12_4_ = uVar16;
                auVar30 = vandps_avx(auVar31,*(undefined1 (*) [16])(ray + 0x90));
                auVar30 = vpcmpeqd_avx(auVar30,_DAT_01f7aa10);
                auVar33 = auVar32._0_16_ & ~auVar30;
                if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar33[0xf] < '\0') {
                  local_26d0 = vandnps_avx(auVar30,auVar32._0_16_);
                  local_2640.geometryUserPtr = local_2610->userPtr;
                  local_2640.valid = (int *)local_26d0;
                  auVar30 = (undefined1  [16])local_2640._0_16_;
                  local_2640.context = context->user;
                  local_2640.N = 4;
                  local_2640.primID =
                       *(undefined4 *)((uVar26 & 0xfffffffffffffff0) + 4 + local_2660 * 8);
                  local_2640._0_20_ = CONCAT416(local_2640.primID,auVar30);
                  local_2608 = 0;
                  local_2600 = context->args;
                  pp_Var17 = (_func_int **)local_2600->intersect;
                  if (pp_Var17 == (_func_int **)0x0) {
                    pp_Var17 = local_2610[1].super_RefCount._vptr_RefCount;
                  }
                  local_2640.rayhit = (RTCRayHitN *)ray;
                  (*(code *)pp_Var17)(&local_2640);
                  auVar64 = ZEXT1664(local_2570);
                  auVar65 = ZEXT1664(local_2580);
                  auVar66 = ZEXT1664(local_2590);
                  auVar67 = ZEXT1664(local_25a0);
                  auVar68 = ZEXT1664(local_25b0);
                  auVar63 = ZEXT1664(local_25c0);
                  auVar32 = ZEXT1664(local_2560);
                  context = local_2680;
                  ray = local_2688;
                  uVar23 = local_2670;
                  uVar24 = local_2678;
                }
                auVar30 = auVar32._0_16_;
                local_2660 = local_2660 + 1;
              } while (local_2668 != local_2660);
            }
            auVar33 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),local_26c0,1);
            auVar33 = auVar30 & auVar33;
            if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar33[0xf] < '\0') {
              local_26c0 = vblendvps_avx(local_26c0,*(undefined1 (*) [16])(ray + 0x80),auVar30);
              auVar30 = vshufps_avx(local_26c0,local_26c0,0xb1);
              auVar30 = vmaxps_avx(auVar30,local_26c0);
              auVar33 = vshufpd_avx(auVar30,auVar30,1);
              local_26b0 = vmaxss_avx(auVar33,auVar30);
            }
          }
        }
        auVar30 = vshufps_avx(local_26b0,local_26b0,0);
        auVar32 = ZEXT1664(auVar30);
LAB_0041ea11:
      } while (puVar18 != &local_23a0);
    } while (local_2690 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }